

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O1

void __thiscall
nestl::impl::vector<int,_nestl::test::allocator_with_state<int>_>::
grow<nestl::has_exceptions::exception_ptr_error>
          (vector<int,_nestl::test::allocator_with_state<int>_> *this,exception_ptr_error *err,
          size_type requiredCapacity)

{
  int *p;
  int *piVar1;
  int *piVar2;
  int *piVar3;
  ulong uVar4;
  ulong n;
  int *piVar5;
  int *piStack_30;
  int **ppiStack_28;
  
  uVar4 = (long)this->m_end_of_storage - (long)this->m_start >> 2;
  n = uVar4 * 3 + 3 >> 1;
  if (n <= requiredCapacity) {
    n = requiredCapacity;
  }
  if (uVar4 < n) {
    piVar3 = test::allocator_with_state<int>::allocate<nestl::has_exceptions::exception_ptr_error>
                       (&this->m_allocator,err,n,(void *)0x0);
    if ((err->m_exception)._M_exception_object == (void *)0x0) {
      piVar1 = this->m_finish;
      p = this->m_start;
      piVar2 = piVar3;
      for (piVar5 = p; piVar5 != piVar1; piVar5 = piVar5 + 1) {
        *piVar2 = *piVar5;
        piVar2 = piVar2 + 1;
      }
      ppiStack_28 = &piStack_30;
      piStack_30 = piVar3;
      test::allocator_with_state<int>::deallocate
                (&this->m_allocator,p,(long)this->m_end_of_storage - (long)p >> 2);
      this->m_start = piVar3;
      this->m_finish = (pointer)(((long)piVar1 - (long)p) + (long)piVar3);
      this->m_end_of_storage = piVar3 + n;
      test::allocator_with_state<int>::deallocate(&this->m_allocator,(int *)0x0,n);
    }
    return;
  }
  __assert_fail("newCapacity > capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                ,0x328,
                "void nestl::impl::vector<int, nestl::test::allocator_with_state<int>>::grow(OperationError &, size_type) [T = int, Allocator = nestl::test::allocator_with_state<int>, OperationError = nestl::has_exceptions::exception_ptr_error]"
               );
}

Assistant:

void
vector<T, A>::grow(OperationError& err, size_type requiredCapacity) NESTL_NOEXCEPT_SPEC
{
    size_t newCapacity = (((capacity() + 1) * 3) / 2);
    if (newCapacity < requiredCapacity)
    {
        newCapacity = requiredCapacity;
    }

    /// @bug overflow error
    assert(newCapacity > capacity());

    reserve_nothrow(err, newCapacity);
}